

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_byteout(opj_mqc_t *mqc)

{
  opj_mqc_t *mqc_local;
  
  if (*mqc->bp == 0xff) {
    mqc->bp = mqc->bp + 1;
    *mqc->bp = (uchar)(mqc->c >> 0x14);
    mqc->c = mqc->c & 0xfffff;
    mqc->ct = 7;
  }
  else if ((mqc->c & 0x8000000) == 0) {
    mqc->bp = mqc->bp + 1;
    *mqc->bp = (uchar)(mqc->c >> 0x13);
    mqc->c = mqc->c & 0x7ffff;
    mqc->ct = 8;
  }
  else {
    *mqc->bp = *mqc->bp + '\x01';
    if (*mqc->bp == 0xff) {
      mqc->c = mqc->c & 0x7ffffff;
      mqc->bp = mqc->bp + 1;
      *mqc->bp = (uchar)(mqc->c >> 0x14);
      mqc->c = mqc->c & 0xfffff;
      mqc->ct = 7;
    }
    else {
      mqc->bp = mqc->bp + 1;
      *mqc->bp = (uchar)(mqc->c >> 0x13);
      mqc->c = mqc->c & 0x7ffff;
      mqc->ct = 8;
    }
  }
  return;
}

Assistant:

static void mqc_byteout(opj_mqc_t *mqc) {
	if (*mqc->bp == 0xff) {
		mqc->bp++;
		*mqc->bp = mqc->c >> 20;
		mqc->c &= 0xfffff;
		mqc->ct = 7;
	} else {
		if ((mqc->c & 0x8000000) == 0) {	/* ((mqc->c&0x8000000)==0) CHANGE */
			mqc->bp++;
			*mqc->bp = mqc->c >> 19;
			mqc->c &= 0x7ffff;
			mqc->ct = 8;
		} else {
			(*mqc->bp)++;
			if (*mqc->bp == 0xff) {
				mqc->c &= 0x7ffffff;
				mqc->bp++;
				*mqc->bp = mqc->c >> 20;
				mqc->c &= 0xfffff;
				mqc->ct = 7;
			} else {
				mqc->bp++;
				*mqc->bp = mqc->c >> 19;
				mqc->c &= 0x7ffff;
				mqc->ct = 8;
			}
		}
	}
}